

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void TypeBuilderSetArrayType
               (TypeBuilderRef builder,BinaryenIndex index,BinaryenType elementType,
               BinaryenPackedType elementPackedType,int elementMutable)

{
  Field element_00;
  undefined8 this;
  BinaryenPackedType BVar1;
  bool bVar2;
  Array local_60;
  BasicType local_4c;
  Type local_48;
  undefined1 local_40 [8];
  Field element;
  TypeBuilder *B;
  int elementMutable_local;
  BinaryenPackedType elementPackedType_local;
  BinaryenType elementType_local;
  BinaryenIndex index_local;
  TypeBuilderRef builder_local;
  
  element._8_8_ = builder;
  wasm::Type::Type(&local_48,elementType);
  wasm::Field::Field((Field *)local_40,local_48,(uint)(elementMutable != 0));
  local_4c = i32;
  bVar2 = wasm::Type::operator==((Type *)local_40,&local_4c);
  this = element._8_8_;
  BVar1 = elementPackedType;
  if ((!bVar2) && (BVar1 = (BinaryenPackedType)element.type.id, elementPackedType != 0)) {
    __assert_fail("elementPackedType == Field::PackedType::not_packed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x18f0,
                  "void TypeBuilderSetArrayType(TypeBuilderRef, BinaryenIndex, BinaryenType, BinaryenPackedType, int)"
                 );
  }
  element.type.id._0_4_ = BVar1;
  element_00.mutable_ = element.type.id._4_4_;
  element_00.packedType = (BinaryenPackedType)element.type.id;
  element_00.type.id = (uintptr_t)local_40;
  wasm::Array::Array(&local_60,element_00);
  wasm::TypeBuilder::setHeapType((TypeBuilder *)this,(ulong)index,&local_60);
  return;
}

Assistant:

void TypeBuilderSetArrayType(TypeBuilderRef builder,
                             BinaryenIndex index,
                             BinaryenType elementType,
                             BinaryenPackedType elementPackedType,
                             int elementMutable) {
  auto* B = (TypeBuilder*)builder;
  Field element(Type(elementType),
                elementMutable ? Mutability::Mutable : Mutability::Immutable);
  if (element.type == Type::i32) {
    element.packedType = Field::PackedType(elementPackedType);
  } else {
    assert(elementPackedType == Field::PackedType::not_packed);
  }
  B->setHeapType(index, Array(element));
}